

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::calcForcesAndTorques(RigidBody *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  Snapshot *pSVar7;
  size_type sVar8;
  reference ppAVar9;
  double *pdVar10;
  long in_RDI;
  uint i;
  int sl;
  int eCount;
  AtomType *atype;
  Vector3d pos;
  Vector3d ef;
  Vector3d trq;
  Vector3d frc;
  Vector3d rpos;
  Vector3d apos;
  Vector3d atrq;
  Vector3d afrc;
  Vector<double,_3U> *in_stack_fffffffffffffdd8;
  AtomType *in_stack_fffffffffffffde0;
  StuntDouble *in_stack_fffffffffffffde8;
  StuntDouble *in_stack_fffffffffffffdf0;
  uint local_13c;
  double local_110;
  Vector<double,_3U> local_108 [2];
  double local_d8;
  Vector<double,_3U> local_d0;
  Vector<double,_3U> local_b8;
  double local_a0;
  Vector<double,_3U> local_98 [2];
  Vector<double,_3U> local_68 [3];
  Vector<double,_3U> local_20;
  
  Vector3<double>::Vector3((Vector3<double> *)0x246f39);
  Vector3<double>::Vector3((Vector3<double> *)0x246f46);
  Vector3<double>::Vector3((Vector3<double> *)0x246f53);
  Vector3<double>::Vector3((Vector3<double> *)0x246f60);
  local_a0 = 0.0;
  Vector<double,_3U>::Vector(local_98,&local_a0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_d8 = 0.0;
  Vector<double,_3U>::Vector(&local_d0,&local_d8);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_110 = 0.0;
  Vector<double,_3U>::Vector(local_108,&local_110);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  StuntDouble::getPos(in_stack_fffffffffffffde8);
  pSVar7 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
  uVar6 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar7->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)));
  for (local_13c = 0;
      sVar8 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), local_13c < sVar8; local_13c = local_13c + 1) {
    ppAVar9 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                         ,(ulong)local_13c);
    Atom::getAtomType(*ppAVar9);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_13c);
    StuntDouble::getFrc(in_stack_fffffffffffffde8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffde0,
               (Vector3<double> *)in_stack_fffffffffffffdd8);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_13c);
    StuntDouble::getPos(in_stack_fffffffffffffde8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffde0,
               (Vector3<double> *)in_stack_fffffffffffffdd8);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                      (Vector<double,_3U> *)in_stack_fffffffffffffde0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffde8,
               (Vector<double,_3U> *)in_stack_fffffffffffffde0);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pdVar10 = Vector<double,_3U>::operator[](local_68,1);
    in_stack_fffffffffffffde0 = (AtomType *)*pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,2);
    in_stack_fffffffffffffde8 = (StuntDouble *)*pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_68,2);
    in_stack_fffffffffffffdd8 = (Vector<double,_3U> *)*pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,1);
    in_stack_fffffffffffffdf0 =
         (StuntDouble *)
         ((double)in_stack_fffffffffffffde0 * (double)in_stack_fffffffffffffde8 +
         -((double)in_stack_fffffffffffffdd8 * *pdVar10));
    pdVar10 = Vector<double,_3U>::operator[](&local_b8,0);
    *pdVar10 = (double)in_stack_fffffffffffffdf0 + *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_68,2);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,0);
    dVar2 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_68,0);
    dVar3 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,2);
    dVar4 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_b8,1);
    *pdVar10 = dVar1 * dVar2 + -(dVar3 * dVar4) + *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_68,0);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,1);
    dVar2 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_68,1);
    dVar3 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_20,0);
    dVar4 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_b8,2);
    *pdVar10 = dVar1 * dVar2 + -(dVar3 * dVar4) + *pdVar10;
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_13c);
    bVar5 = Atom::isDirectional((Atom *)0x2473c1);
    if (bVar5) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
                 (ulong)local_13c);
      StuntDouble::getTrq(in_stack_fffffffffffffde8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffde0,
                 (Vector3<double> *)in_stack_fffffffffffffdd8);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
    if (((uVar6 & 0x1000) != 0) &&
       (bVar5 = AtomType::isElectrostatic(in_stack_fffffffffffffde0), bVar5)) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
                 (ulong)local_13c);
      StuntDouble::getElectricField(in_stack_fffffffffffffde8);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
  }
  StuntDouble::addFrc(in_stack_fffffffffffffdf0,(Vector3d *)in_stack_fffffffffffffde8);
  StuntDouble::addTrq(in_stack_fffffffffffffdf0,(Vector3d *)in_stack_fffffffffffffde8);
  if ((uVar6 & 0x1000) != 0) {
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8);
    StuntDouble::setElectricField(in_stack_fffffffffffffdf0,(Vector3d *)in_stack_fffffffffffffde8);
  }
  return;
}

Assistant:

void RigidBody::calcForcesAndTorques() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    Vector3d pos = this->getPos();
    AtomType* atype;
    int eCount = 0;

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }
  }